

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_tests.cpp
# Opt level: O0

void __thiscall
iu_TestFixtureLikeVCUnit_x_iutest_x_Test_Test::Body
          (iu_TestFixtureLikeVCUnit_x_iutest_x_Test_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_TestFixtureLikeVCUnit_x_iutest_x_Test_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c = 1;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"1","x",&local_3c,&TestFixtureLikeVCUnit::x);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/fixture_tests.cpp"
               ,0x77,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (bVar1) {
    TestFixtureLikeVCUnit::x = TestFixtureLikeVCUnit::x + 1;
  }
  return;
}

Assistant:

IUTEST_F(TestFixtureLikeVCUnit, Test)
{
    IUTEST_ASSERT_EQ(1, x);
    ++x;
}